

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_Repeated_Test::
MessageDifferencerTest_IgnoreField_Repeated_Test
          (MessageDifferencerTest_IgnoreField_Repeated_Test *this)

{
  MessageDifferencerTest_IgnoreField_Repeated_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__MessageDifferencerTest_IgnoreField_Repeated_Test_02a24a58;
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_Repeated) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_c(3);
  msg1.add_rc(1);
  msg1.add_rc(2);

  msg2.set_c(3);
  msg2.add_rc(1);
  msg2.add_rc(3);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "rc"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}